

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O2

IModelVisualization * __thiscall
iDynTree::Visualizer::modelViz(Visualizer *this,string *instanceName)

{
  Visualizer *this_00;
  string in_stack_ffffffffffffffd8;
  
  this_00 = (Visualizer *)&stack0xffffffffffffffd8;
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd8,(string *)instanceName);
  getModelInstanceIndex(this_00,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  return &(this->pimpl->m_invalidModelViz).super_IModelVisualization;
}

Assistant:

IModelVisualization& Visualizer::modelViz(const std::string& instanceName)
{
    int idx = getModelInstanceIndex(instanceName);
    if( idx < 0 )
    {
        return this->pimpl->m_invalidModelViz;
    }

#ifdef IDYNTREE_USES_IRRLICHT
    return *(this->pimpl->m_modelViz->at(idx));
#else
    return this->pimpl->m_invalidModelViz;
#endif
}